

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linear_workflow.cpp
# Opt level: O1

ON__UINT32 __thiscall ON_LinearWorkflow::DataCRC(ON_LinearWorkflow *this,ON__UINT32 crc)

{
  int iVar1;
  ON__UINT32 OVar2;
  float dirty;
  float dirty_00;
  bool b [4];
  ON__INT64 f [2];
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  ON__INT64 local_28;
  ON__INT64 local_20;
  
  iVar1 = (*this->_vptr_ON_LinearWorkflow[5])();
  local_2c = (undefined1)iVar1;
  iVar1 = (*this->_vptr_ON_LinearWorkflow[7])(this);
  local_2b = (undefined1)iVar1;
  iVar1 = (*this->_vptr_ON_LinearWorkflow[9])(this);
  local_2a = (undefined1)iVar1;
  iVar1 = (*this->_vptr_ON_LinearWorkflow[0xf])(this);
  local_29 = (undefined1)iVar1;
  OVar2 = ON_CRC32(crc,4,&local_2c);
  (*this->_vptr_ON_LinearWorkflow[0xd])(this);
  local_28 = Integerize(dirty);
  (*this->_vptr_ON_LinearWorkflow[0x11])(this);
  local_20 = Integerize(dirty_00);
  OVar2 = ON_CRC32(OVar2,0x10,&local_28);
  return OVar2;
}

Assistant:

ON__UINT32 ON_LinearWorkflow::DataCRC(ON__UINT32 crc) const
{
  bool b[] = { PreProcessTexturesOn(), PreProcessColorsOn(), PostProcessFrameBufferOn(), PostProcessGammaOn() };
  crc = ON_CRC32(crc, sizeof(b), b);

  ON__INT64 f[] = { Integerize(PreProcessGamma()), Integerize(PostProcessGamma()) };
  crc = ON_CRC32(crc, sizeof(f), f);

  return crc;
}